

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>,_std::shared_ptr<kratos::Var>_>
::load(list_caster<std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>,_std::shared_ptr<kratos::Var>_>
       *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  PyObject *pPVar3;
  object *poVar4;
  PyObject *pPVar5;
  undefined1 local_98 [8];
  value_conv conv;
  reference it;
  handle local_40;
  sequence s;
  
  if (((src.m_ptr == (PyObject *)0x0) || (iVar2 = PySequence_Check(src.m_ptr), iVar2 == 0)) ||
     (((src.m_ptr)->ob_type->tp_flags & 0x18000000) != 0)) {
    return false;
  }
  (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
  local_40.m_ptr = src.m_ptr;
  std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::clear
            (&this->value);
  __n = sequence::size((sequence *)&local_40);
  std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::reserve
            (&this->value,__n);
  it.cache.super_handle.m_ptr = (handle)(handle)local_40.m_ptr;
  pPVar3 = (PyObject *)PySequence_Size();
  bVar1 = true;
  if (pPVar3 != (PyObject *)0x0) {
    pPVar5 = (PyObject *)0x0;
    do {
      it._0_8_ = it.cache.super_handle.m_ptr;
      it.key = 0;
      it.obj.m_ptr = pPVar5;
      type_caster_generic::type_caster_generic
                ((type_caster_generic *)local_98,(type_info *)&kratos::Var::typeinfo);
      conv.super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>.
      super_type_caster_base<kratos::Var>.super_type_caster_generic.value = (void *)0x0;
      conv.super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>.holder.
      super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      poVar4 = accessor<pybind11::detail::accessor_policies::sequence_item>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::sequence_item> *)
                          &conv.
                           super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>
                           .holder.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      s.super_object.super_handle.m_ptr = (object)(poVar4->super_handle).m_ptr;
      if (s.super_object.super_handle.m_ptr != (handle)0x0) {
        ((PyObject *)s.super_object.super_handle.m_ptr)->ob_refcnt =
             ((PyObject *)s.super_object.super_handle.m_ptr)->ob_refcnt + 1;
      }
      bVar1 = type_caster_generic::
              load_impl<pybind11::detail::copyable_holder_caster<kratos::Var,std::shared_ptr<kratos::Var>,void>>
                        ((type_caster_generic *)local_98,(handle)s.super_object.super_handle.m_ptr,
                         convert);
      object::~object(&s.super_object);
      if (!bVar1) {
        if (conv.super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>.
            holder.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     conv.
                     super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>.
                     holder.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        object::~object((object *)&it.key);
        bVar1 = false;
        goto LAB_002b9856;
      }
      std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
      push_back(&this->value,
                (value_type *)
                &conv.super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>.
                 super_type_caster_base<kratos::Var>.super_type_caster_generic.value);
      if (conv.super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>.holder.
          super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   conv.
                   super_copyable_holder_caster<kratos::Var,_std::shared_ptr<kratos::Var>,_void>.
                   holder.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      object::~object((object *)&it.key);
      pPVar5 = (PyObject *)((long)&pPVar5->ob_refcnt + 1);
    } while (pPVar3 != pPVar5);
    bVar1 = true;
  }
LAB_002b9856:
  object::~object((object *)&local_40);
  return bVar1;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<bytes>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }